

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallCxxModuleBmiGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallCxxModuleBmiGenerator *this,string *config)

{
  string local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,(string *)&(this->super_cmInstallGenerator).Destination);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  cmGeneratorExpression::Evaluate
            (__return_storage_ptr__,&local_40,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCxxModuleBmiGenerator::GetDestination(
  std::string const& config) const
{
  return cmGeneratorExpression::Evaluate(this->Destination,
                                         this->LocalGenerator, config);
}